

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void http_close(nni_http_conn *conn)

{
  nni_aio *pnVar1;
  nni_aio *aio;
  nni_http_conn *conn_local;
  
  if ((conn->closed & 1U) == 0) {
    conn->closed = true;
    nni_aio_close(&conn->wr_aio);
    nni_aio_close(&conn->rd_aio);
    pnVar1 = conn->rd_uaio;
    if (pnVar1 != (nni_aio *)0x0) {
      conn->rd_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
    pnVar1 = conn->wr_uaio;
    if (pnVar1 != (nni_aio *)0x0) {
      conn->wr_uaio = (nni_aio *)0x0;
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
    while (pnVar1 = (nni_aio *)nni_list_first(&conn->wrq), pnVar1 != (nni_aio *)0x0) {
      nni_aio_list_remove(pnVar1);
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
    while (pnVar1 = (nni_aio *)nni_list_first(&conn->rdq), pnVar1 != (nni_aio *)0x0) {
      nni_aio_list_remove(pnVar1);
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
    if (conn->sock != (nng_stream *)0x0) {
      nng_stream_close(conn->sock);
    }
  }
  return;
}

Assistant:

static void
http_close(nni_http_conn *conn)
{
	// Call with lock held.
	nni_aio *aio;

	if (conn->closed) {
		return;
	}

	conn->closed = true;
	nni_aio_close(&conn->wr_aio);
	nni_aio_close(&conn->rd_aio);

	if ((aio = conn->rd_uaio) != NULL) {
		conn->rd_uaio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	if ((aio = conn->wr_uaio) != NULL) {
		conn->wr_uaio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	// Abort all operations except the one in flight.
	while ((aio = nni_list_first(&conn->wrq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	while ((aio = nni_list_first(&conn->rdq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	if (conn->sock != NULL) {
		nng_stream_close(conn->sock);
	}
}